

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfailure.h
# Opt level: O3

void __thiscall
UnitTests::TestFailure::TestFailure
          (TestFailure *this,string *msg,string *file,int line,string *failure_type,int error_code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  pointer pcVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_type sVar10;
  ulong *local_88;
  long local_80;
  ulong local_78;
  undefined8 uStack_70;
  string local_68;
  string local_48;
  
  *(undefined ***)this = &PTR__TestFailure_0011ed38;
  local_68._M_dataplus._M_p = (file->_M_dataplus)._M_p;
  paVar1 = &file->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&file->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = file->_M_string_length;
  (file->_M_dataplus)._M_p = (pointer)paVar1;
  file->_M_string_length = 0;
  (file->field_2)._M_local_buf[0] = '\0';
  FormatError(&local_48,&local_68,line,error_code);
  uVar5 = failure_type->_M_string_length + local_48._M_string_length;
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    uVar8 = local_48.field_2._M_allocated_capacity;
  }
  pcVar6 = (failure_type->_M_dataplus)._M_p;
  if ((ulong)uVar8 < uVar5) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &failure_type->field_2) {
      uVar9 = (failure_type->field_2)._M_allocated_capacity;
    }
    if (uVar9 < uVar5) goto LAB_0010a86b;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)failure_type,0,(char *)0x0,(ulong)local_48._M_dataplus._M_p);
  }
  else {
LAB_0010a86b:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)pcVar6);
  }
  local_88 = &local_78;
  puVar2 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar2) {
    local_78 = *puVar2;
    uStack_70 = puVar7[3];
  }
  else {
    local_78 = *puVar2;
    local_88 = (ulong *)*puVar7;
  }
  local_80 = puVar7[1];
  *puVar7 = puVar2;
  puVar7[1] = 0;
  *(undefined1 *)puVar2 = 0;
  uVar5 = msg->_M_string_length + local_80;
  uVar9 = 0xf;
  if (local_88 != &local_78) {
    uVar9 = local_78;
  }
  pcVar6 = (msg->_M_dataplus)._M_p;
  if (uVar9 < uVar5) {
    sVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &msg->field_2) {
      sVar10 = (msg->field_2)._M_allocated_capacity;
    }
    if (uVar5 <= sVar10) {
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)msg,0,(char *)0x0,(ulong)local_88)
      ;
      goto LAB_0010a922;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)pcVar6);
LAB_0010a922:
  paVar1 = &(this->m_what).field_2;
  (this->m_what)._M_dataplus._M_p = (pointer)paVar1;
  psVar3 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar3) {
    uVar8 = puVar7[3];
    paVar1->_M_allocated_capacity = *psVar3;
    *(undefined8 *)((long)&(this->m_what).field_2 + 8) = uVar8;
  }
  else {
    (this->m_what)._M_dataplus._M_p = (pointer)*puVar7;
    (this->m_what).field_2._M_allocated_capacity = *psVar3;
  }
  (this->m_what)._M_string_length = puVar7[1];
  *puVar7 = psVar3;
  puVar7[1] = 0;
  *(undefined1 *)psVar3 = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &(this->m_msg).field_2;
  (this->m_msg)._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (msg->_M_dataplus)._M_p;
  paVar4 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 == paVar4) {
    uVar8 = *(undefined8 *)((long)&msg->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_msg).field_2 + 8) = uVar8;
  }
  else {
    (this->m_msg)._M_dataplus._M_p = pcVar6;
    (this->m_msg).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->m_msg)._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar4;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

TestFailure(std::string msg, std::string file, int line, std::string failure_type, int error_code)
            : m_what(FormatError(std::move(file), line, error_code) + std::move(failure_type) + std::move(msg)),
              m_msg(std::move(msg))
        {
        }